

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

void __thiscall capnp::compiler::NodeTranslator::~NodeTranslator(NodeTranslator *this)

{
  kj::ArrayBuilder<capnp::compiler::NodeTranslator::UnfinishedValue>::dispose
            (&(this->unfinishedValues).builder);
  kj::ArrayBuilder<capnp::compiler::NodeTranslator::AuxNode>::dispose(&(this->paramStructs).builder)
  ;
  kj::ArrayBuilder<capnp::compiler::NodeTranslator::AuxNode>::dispose(&(this->groups).builder);
  capnp::_::OrphanBuilder::~OrphanBuilder(&(this->sourceInfo).builder);
  capnp::_::OrphanBuilder::~OrphanBuilder(&(this->wipNode).builder);
  kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>::dispose(&this->localBrand);
  return;
}

Assistant:

NodeTranslator::~NodeTranslator() noexcept(false) {}